

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O0

ostream * Libdbc::operator<<(ostream *out,Signal *sig)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  char *pcVar3;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reciever;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  long local_18;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar2 = std::operator<<(in_RDI,"Signal {name: ");
  poVar2 = std::operator<<(poVar2,(string *)(local_10 + 8));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Multiplexed: ");
  pcVar3 = "False";
  if ((*(byte *)(local_10 + 0x28) & 1) != 0) {
    pcVar3 = "True";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Start bit: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_10 + 0x2c));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Size: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_10 + 0x30));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Endianness: ");
  pcVar3 = "Little endian";
  if ((*(byte *)(local_10 + 0x34) & 1) != 0) {
    pcVar3 = "Big endian";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Value Type: ");
  pcVar3 = "Unsigned";
  if ((*(byte *)(local_10 + 0x35) & 1) != 0) {
    pcVar3 = "Signed";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Min: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(local_10 + 0x48));
  poVar2 = std::operator<<(poVar2,", Max: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(local_10 + 0x50));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(local_8,"Unit: (");
  poVar2 = std::operator<<(poVar2,(string *)(local_10 + 0x58));
  std::operator<<(poVar2,"), ");
  std::operator<<(local_8,"receivers: ");
  local_18 = local_10 + 0x78;
  local_20._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_20);
    std::operator<<(local_8,(string *)in_stack_ffffffffffffffd0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_20);
  }
  poVar2 = std::operator<<(local_8,"}");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signal& sig) {
	out << "Signal {name: " << sig.name << ", ";
	out << "Multiplexed: " << (sig.is_multiplexed ? "True" : "False") << ", ";
	out << "Start bit: " << sig.start_bit << ", ";
	out << "Size: " << sig.size << ", ";
	out << "Endianness: " << (sig.is_bigendian ? "Big endian" : "Little endian") << ", ";
	out << "Value Type: " << (sig.is_signed ? "Signed" : "Unsigned") << ", ";
	out << "Min: " << sig.min << ", Max: " << sig.max << ", ";
	out << "Unit: (" << sig.unit << "), ";
	out << "receivers: ";
	for (const auto& reciever : sig.receivers) {
		out << reciever;
	}
	return out << "}";
}